

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O2

JoystickState * __thiscall
sf::priv::JoystickImpl::update(JoystickState *__return_storage_ptr__,JoystickImpl *this)

{
  undefined3 uVar1;
  ssize_t sVar2;
  int *piVar3;
  long lVar4;
  JoystickState *pJVar5;
  JoystickState *pJVar6;
  bool bVar7;
  byte bVar8;
  float fVar9;
  js_event joyState;
  
  bVar8 = 0;
  if (this->m_file < 0) {
    JoystickState::JoystickState((JoystickState *)&joyState);
    pJVar5 = (JoystickState *)&joyState;
    pJVar6 = &this->m_state;
    for (lVar4 = 0x11; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar1 = *(undefined3 *)&pJVar5->field_0x1;
      pJVar6->connected = pJVar5->connected;
      *(undefined3 *)&pJVar6->field_0x1 = uVar1;
      pJVar5 = (JoystickState *)((long)pJVar5 + (ulong)bVar8 * -8 + 4);
      pJVar6 = (JoystickState *)((long)pJVar6 + (ulong)bVar8 * -8 + 4);
    }
  }
  else {
    sVar2 = read(this->m_file,(JoystickState *)&joyState,8);
    while (0 < (int)sVar2) {
      if ((joyState.type & 0x7f) == 1) {
        if ((ulong)joyState.number < 0x20) {
          (this->m_state).buttons[joyState.number] = joyState.value != 0;
        }
      }
      else if ((joyState.type & 0x7f) == 2) {
        fVar9 = ((float)(int)joyState.value * 100.0) / 32767.0;
        if ((ulong)joyState.number < 0x40) {
          switch(this->m_mapping[joyState.number]) {
          case '\0':
            (this->m_state).axes[0] = fVar9;
            break;
          case '\x01':
            (this->m_state).axes[1] = fVar9;
            break;
          case '\x02':
          case '\x06':
            (this->m_state).axes[2] = fVar9;
            break;
          case '\x03':
            (this->m_state).axes[4] = fVar9;
            break;
          case '\x04':
            (this->m_state).axes[5] = fVar9;
            break;
          case '\x05':
          case '\a':
            (this->m_state).axes[3] = fVar9;
            break;
          case '\x10':
            (this->m_state).axes[6] = fVar9;
            break;
          case '\x11':
            (this->m_state).axes[7] = fVar9;
          }
        }
      }
      sVar2 = read(this->m_file,(JoystickState *)&joyState,8);
    }
    if ((int)sVar2 == 0) {
      bVar7 = true;
    }
    else {
      piVar3 = __errno_location();
      bVar7 = *piVar3 == 0xb;
    }
    (this->m_state).connected = bVar7;
  }
  pJVar5 = &this->m_state;
  pJVar6 = __return_storage_ptr__;
  for (lVar4 = 0x11; lVar4 != 0; lVar4 = lVar4 + -1) {
    uVar1 = *(undefined3 *)&pJVar5->field_0x1;
    pJVar6->connected = pJVar5->connected;
    *(undefined3 *)&pJVar6->field_0x1 = uVar1;
    pJVar5 = (JoystickState *)((long)pJVar5 + (ulong)bVar8 * -8 + 4);
    pJVar6 = (JoystickState *)((long)pJVar6 + (ulong)bVar8 * -8 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

JoystickState JoystickImpl::JoystickImpl::update()
{
    if (m_file < 0)
    {
        m_state = JoystickState();
        return m_state;
    }

    // pop events from the joystick file
    js_event joyState;
    int result = read(m_file, &joyState, sizeof(joyState));
    while (result > 0)
    {
        switch (joyState.type & ~JS_EVENT_INIT)
        {
            // An axis was moved
            case JS_EVENT_AXIS:
            {
                float value = joyState.value * 100.f / 32767.f;

                if (joyState.number < ABS_MAX + 1)
                {
                    switch (m_mapping[joyState.number])
                    {
                        case ABS_X:        m_state.axes[Joystick::X]    = value; break;
                        case ABS_Y:        m_state.axes[Joystick::Y]    = value; break;
                        case ABS_Z:
                        case ABS_THROTTLE: m_state.axes[Joystick::Z]    = value; break;
                        case ABS_RZ:
                        case ABS_RUDDER:   m_state.axes[Joystick::R]    = value; break;
                        case ABS_RX:       m_state.axes[Joystick::U]    = value; break;
                        case ABS_RY:       m_state.axes[Joystick::V]    = value; break;
                        case ABS_HAT0X:    m_state.axes[Joystick::PovX] = value; break;
                        case ABS_HAT0Y:    m_state.axes[Joystick::PovY] = value; break;
                        default:           break;
                    }
                }
                break;
            }

            // A button was pressed
            case JS_EVENT_BUTTON:
            {
                if (joyState.number < Joystick::ButtonCount)
                    m_state.buttons[joyState.number] = (joyState.value != 0);
                break;
            }
        }

        result = read(m_file, &joyState, sizeof(joyState));
    }

    // Check the connection state of the joystick
    // read() returns -1 and errno != EGAIN if it's no longer connected
    // We need to check the result of read() as well, since errno could
    // have been previously set by some other function call that failed
    // result can be either negative or 0 at this point
    // If result is 0, assume the joystick is still connected
    // If result is negative, check errno and disconnect if it is not EAGAIN
    m_state.connected = (!result || (errno == EAGAIN));

    return m_state;
}